

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

long os_get_sys_clock_ms(void)

{
  int iVar1;
  long lVar2;
  
  if (os_get_sys_clock_ms::start == '\0') {
    iVar1 = __cxa_guard_acquire(&os_get_sys_clock_ms::start);
    if (iVar1 != 0) {
      os_get_sys_clock_ms::start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      __cxa_guard_release(&os_get_sys_clock_ms::start);
    }
  }
  lVar2 = std::chrono::_V2::steady_clock::now();
  return (lVar2 - (long)os_get_sys_clock_ms::start.__d.__r) / 1000000;
}

Assistant:

long
os_get_sys_clock_ms( void )
{
    using namespace std::chrono;
    static const auto start = steady_clock::now();
    return duration_cast<milliseconds>(steady_clock::now() - start).count();
}